

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metalog.h
# Opt level: O1

void __thiscall MetaLog<deflog>::MetaLog(MetaLog<deflog> *this)

{
  MultiStreamWriter<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::basic_ofstream<char,_std::char_traits<char>_>_*>
  *this_00;
  
  (this->latest_).
  super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->latest_).
  super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->latest_).
  super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hash_set_)._M_h._M_buckets = &(this->hash_set_)._M_h._M_single_bucket;
  (this->hash_set_)._M_h._M_bucket_count = 1;
  (this->hash_set_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->hash_set_)._M_h._M_element_count = 0;
  (this->hash_set_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->hash_set_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->hash_set_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->dout_ = (ostream *)&std::cout;
  this->fout_ = (ofstream *)0x0;
  this_00 = (MultiStreamWriter<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::basic_ofstream<char,_std::char_traits<char>_>_*>
             *)operator_new(0x18);
  MultiStreamWriter<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::basic_ofstream<char,_std::char_traits<char>_>_*>
  ::MultiStreamWriter(this_00,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                      (basic_ofstream<char,_std::char_traits<char>_> *)0x0);
  this->mwriter_ = this_00;
  this->max_log_level_ = VERBOSE;
  return;
}

Assistant:

constexpr MetaLog() {
		dout_ = &std::cout;
		fout_ = nullptr;
		mwriter_ = new MultiStreamWriter<decltype(dout_), decltype(fout_)>(dout_, fout_);
		max_log_level_ = static_cast<typename T::type>(0);
		static_assert(std::is_convertible<typename T::type, int>::value, "selected log type enum should be convertible to int");
	}